

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteArg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,ArgSlot arg,RegSlot reg)

{
  bool bVar1;
  undefined1 local_13 [8];
  OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((DAT_0159efbd == '\0') && (arg < 0x100)) && (reg < 0x10000)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_13,3);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteArg(OpCode op, ArgSlot arg, RegSlot reg)
    {
        OpLayoutT_Arg<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Arg, arg) && SizePolicy::Assign(layout.Reg, reg))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }